

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O3

void __thiscall QFont::setFamilies(QFont *this,QStringList *families)

{
  byte *pbVar1;
  compare_eq_result_container<QList<QString>,_QString> cVar2;
  
  if (((this->resolve_mask & 0x20000) != 0) &&
     (cVar2 = QList<QString>::operator==(&(((this->d).d.ptr)->request).families,families), cVar2)) {
    return;
  }
  detach(this);
  QArrayDataPointer<QString>::operator=
            ((QArrayDataPointer<QString> *)&((this->d).d.ptr)->request,&families->d);
  pbVar1 = (byte *)((long)&this->resolve_mask + 2);
  *pbVar1 = *pbVar1 | 2;
  return;
}

Assistant:

void QFont::setFamilies(const QStringList &families)
{
    if ((resolve_mask & QFont::FamiliesResolved) && d->request.families == families)
        return;
    detach();
    d->request.families = families;
    resolve_mask |= QFont::FamiliesResolved;
}